

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

GLenum toGlCompareOp(CompareOp op)

{
  CompareOp op_local;
  GLenum local_4;
  
  switch(op) {
  case Never:
    local_4 = 0x200;
    break;
  case Less:
    local_4 = 0x201;
    break;
  case Equal:
    local_4 = 0x202;
    break;
  case LessOrEqual:
    local_4 = 0x203;
    break;
  case Greater:
    local_4 = 0x204;
    break;
  case NotEqual:
    local_4 = 0x205;
    break;
  case GreaterOrEqual:
    local_4 = 0x206;
    break;
  case Always:
    local_4 = 0x207;
  }
  return local_4;
}

Assistant:

static inline GLenum toGlCompareOp(QRhiGraphicsPipeline::CompareOp op)
{
    switch (op) {
    case QRhiGraphicsPipeline::Never:
        return GL_NEVER;
    case QRhiGraphicsPipeline::Less:
        return GL_LESS;
    case QRhiGraphicsPipeline::Equal:
        return GL_EQUAL;
    case QRhiGraphicsPipeline::LessOrEqual:
        return GL_LEQUAL;
    case QRhiGraphicsPipeline::Greater:
        return GL_GREATER;
    case QRhiGraphicsPipeline::NotEqual:
        return GL_NOTEQUAL;
    case QRhiGraphicsPipeline::GreaterOrEqual:
        return GL_GEQUAL;
    case QRhiGraphicsPipeline::Always:
        return GL_ALWAYS;
    default:
        Q_UNREACHABLE_RETURN(GL_ALWAYS);
    }
}